

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GetVectorOfNonStructAsNumpy
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  IdlNamer *pIVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if ((field->value).type.element - BASE_TYPE_UTYPE < 0xc) {
    GenReceiver(this,struct_def,code_ptr);
    pIVar1 = &this->namer_;
    (*(this->namer_).super_Namer._vptr_Namer[4])(&local_130,pIVar1,field);
    std::operator+(&local_150,&local_130,"AsNumpy(self):");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
    if ((field->value).type.base_type == BASE_TYPE_ARRAY) {
      GenIndents_abi_cxx11_(&local_130,this,2);
      std::operator+(&local_150,&local_130,"return ");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::append((char *)code_ptr);
      local_110._0_4_ = (field->value).type.element;
      local_110._24_2_ = (field->value).type.fixed_length;
      local_110._4_4_ = BASE_TYPE_NONE;
      local_110._8_8_ = (field->value).type.struct_def;
      local_110._16_8_ = (field->value).type.enum_def;
      GenTypeGet_abi_cxx11_(&local_130,this,(Type *)local_110);
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (&local_150,pIVar1,&local_130,(ulong)(this->namer_).super_Namer.config_.methods);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      NumToString<unsigned_short>(&local_50,(field->value).offset);
      std::operator+(&local_70,"Flags, self._tab.Pos + ",&local_50);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     &local_70,", ");
      (*(pIVar1->super_Namer)._vptr_Namer[4])(&local_f0,pIVar1,field);
      std::operator+(&local_d0,"self.",&local_f0);
      std::operator+(&local_b0,&local_d0,"Length()");
      NumToString<std::__cxx11::string>(&local_90,(flatbuffers *)&local_b0,t);
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     &local_90);
      std::operator+(&local_150,&local_130,")\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)&local_70);
      this_00 = &local_50;
    }
    else {
      OffsetPrefix_abi_cxx11_(&local_150,this,field,false);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_150);
      GenIndents_abi_cxx11_(&local_150,this,3);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::append((char *)code_ptr);
      std::__cxx11::string::append((char *)code_ptr);
      GenTypeGet_abi_cxx11_(&local_130,this,&(field->value).type);
      (*(this->namer_).super_Namer._vptr_Namer[0x14])
                (&local_150,pIVar1,&local_130,(ulong)(this->namer_).super_Namer.config_.methods);
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::append((char *)code_ptr);
      GenIndents_abi_cxx11_(&local_130,this,2);
      std::operator+(&local_150,&local_130,"return 0\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_150);
      this_00 = &local_130;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::append((char *)code_ptr);
  }
  return;
}

Assistant:

std::string EnumType(const EnumDef &enum_def, Imports *imports) const {
    imports->Import("typing");
    const Import &import =
        imports->Import(ModuleFor(&enum_def), namer_.Type(enum_def));

    std::string result = "";
    for (const EnumVal *val : enum_def.Vals()) {
      if (!result.empty()) result += ", ";
      result += import.name + "." + namer_.Variant(*val);
    }
    return "typing.Literal[" + result + "]";
  }